

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::vector3h>
          (Attribute *this,double t,vector3h *dst,TimeSampleInterpolationType tinterp)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::vector3h> v;
  optional<tinyusdz::value::vector3h> local_38;
  optional<tinyusdz::value::vector3h> local_30;
  
  if (dst == (vector3h *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar2 = primvar::PrimVar::has_value(&this->_var);
    if (bVar2) {
      primvar::PrimVar::get_value<tinyusdz::value::vector3h>(&local_38,&this->_var);
      local_30.has_value_ = local_38.has_value_;
      if (local_38.has_value_ != false) {
        local_30.contained._4_2_ = local_38.contained._4_2_;
        local_30.contained._0_4_ = local_38.contained._0_4_;
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3h>::value(&local_30);
        hVar1.value = (pvVar3->y).value;
        dst->x = (half)(pvVar3->x).value;
        dst->y = (half)hVar1.value;
        (dst->z).value = (pvVar3->z).value;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<tinyusdz::value::vector3h>(this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::vector3h>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }